

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O3

int ngram_search_find_exit(ngram_search_t *ngs,int frame_idx,int32 *out_best_score)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int32 *piVar6;
  
  iVar1 = ngs->n_frame;
  if (iVar1 == 0) {
    return -1;
  }
  uVar5 = (ulong)(iVar1 - 1U);
  if (frame_idx < iVar1) {
    uVar5 = (ulong)(uint)frame_idx;
  }
  if (frame_idx == -1) {
    uVar5 = (ulong)(iVar1 - 1U);
  }
  if ((int)uVar5 < 0) {
    return -1;
  }
  iVar1 = ngs->bp_table_idx[(int)uVar5];
  while( true ) {
    iVar4 = (int)uVar5;
    iVar3 = ngs->bp_table_idx[uVar5];
    if (iVar3 != iVar1) break;
    uVar5 = (ulong)(iVar4 - 1);
    if (iVar4 < 1) {
      return -1;
    }
  }
  if (ngs->bp_table_size <= iVar1) {
    __assert_fail("end_bpidx < ngs->bp_table_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                  ,0x20f,"int ngram_search_find_exit(ngram_search_t *, int, int32 *)");
  }
  if (iVar3 < iVar1) {
    piVar6 = &ngs->bp_table[iVar3].score;
    iVar2 = -1;
    iVar4 = -0x20000000;
    do {
      if (piVar6[-2] == (ngs->base).finish_wid) {
        iVar4 = *piVar6;
        iVar2 = iVar3;
        break;
      }
      if (iVar4 < *piVar6) {
        iVar4 = *piVar6;
        iVar2 = iVar3;
      }
      iVar3 = iVar3 + 1;
      piVar6 = piVar6 + 9;
    } while (iVar1 != iVar3);
  }
  else {
    iVar4 = -0x20000000;
    iVar2 = -1;
  }
  if (out_best_score != (int32 *)0x0) {
    *out_best_score = iVar4;
  }
  return iVar2;
}

Assistant:

int
ngram_search_find_exit(ngram_search_t *ngs, int frame_idx, int32 *out_best_score)
{
    /* End of backpointers for this frame. */
    int end_bpidx;
    int best_exit, bp;
    int32 best_score;

    /* No hypothesis means no exit node! */
    if (ngs->n_frame == 0)
        return NO_BP;

    if (frame_idx == -1 || frame_idx >= ngs->n_frame)
        frame_idx = ngs->n_frame - 1;
    end_bpidx = ngs->bp_table_idx[frame_idx];

    best_score = WORST_SCORE;
    best_exit = NO_BP;

    /* Scan back to find a frame with some backpointers in it. */
    while (frame_idx >= 0 && ngs->bp_table_idx[frame_idx] == end_bpidx)
        --frame_idx;
    /* This is NOT an error, it just means there is no hypothesis yet. */
    if (frame_idx < 0)
        return NO_BP;

    /* Now find the entry for </s> OR the best scoring entry. */
    assert(end_bpidx < ngs->bp_table_size);
    for (bp = ngs->bp_table_idx[frame_idx]; bp < end_bpidx; ++bp) {
        if (ngs->bp_table[bp].wid == ps_search_finish_wid(ngs)
            || ngs->bp_table[bp].score BETTER_THAN best_score) {
            best_score = ngs->bp_table[bp].score;
            best_exit = bp;
        }
        if (ngs->bp_table[bp].wid == ps_search_finish_wid(ngs))
            break;
    }

    if (out_best_score) {
	*out_best_score = best_score;
    }
    return best_exit;
}